

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O2

vector<JSONNode,_std::allocator<JSONNode>_> * __thiscall
ser::MetainfoSet::GenerateNodes
          (vector<JSONNode,_std::allocator<JSONNode>_> *__return_storage_ptr__,MetainfoSet *this)

{
  _Rb_tree_node_base *this_00;
  double value_t;
  bool bVar1;
  int value_t_00;
  _Base_ptr p_Var2;
  ostream *poVar3;
  undefined *puVar4;
  SerializationException *this_01;
  any *operand;
  type_info *this_02;
  float value_t_01;
  JSONNode local_218;
  string local_210 [32];
  SerializationException exception;
  json_string local_1c8;
  ostringstream ss;
  
  (__return_storage_ptr__->super__Vector_base<JSONNode,_std::allocator<JSONNode>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<JSONNode,_std::allocator<JSONNode>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<JSONNode,_std::allocator<JSONNode>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<JSONNode,_std::allocator<JSONNode>_>::reserve
            (__return_storage_ptr__,(this->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var2 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_1c8,(string *)(p_Var2 + 1));
    this_02 = (type_info *)&void::typeinfo;
    if (*(long **)(p_Var2 + 2) != (long *)0x0) {
      this_02 = (type_info *)(**(code **)(**(long **)(p_Var2 + 2) + 0x10))();
    }
    this_00 = p_Var2 + 2;
    bVar1 = std::type_info::operator==(this_02,(type_info *)&bool::typeinfo);
    if (bVar1) {
      bVar1 = boost::any_cast<bool>((any *)this_00);
      ::JSONNode::JSONNode(&local_218,&local_1c8,bVar1);
    }
    else {
      bVar1 = std::type_info::operator==(this_02,(type_info *)&int::typeinfo);
      if (bVar1) {
        value_t_00 = boost::any_cast<int>((any *)this_00);
        ::JSONNode::JSONNode(&local_218,&local_1c8,value_t_00);
      }
      else {
        bVar1 = std::type_info::operator==(this_02,(type_info *)&float::typeinfo);
        if (bVar1) {
          value_t_01 = boost::any_cast<float>((any *)this_00);
          ::JSONNode::JSONNode(&local_218,&local_1c8,value_t_01);
        }
        else {
          bVar1 = std::type_info::operator==(this_02,(type_info *)&double::typeinfo);
          if (bVar1) {
            value_t = boost::any_cast<double>((any *)this_00);
            ::JSONNode::JSONNode(&local_218,&local_1c8,value_t);
          }
          else {
            bVar1 = std::type_info::operator==(this_02,(type_info *)&std::__cxx11::string::typeinfo)
            ;
            if (!bVar1) {
              exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
              exception._0_8_ = &PTR__SerializationException_00138910;
              exception.message_._M_string_length = 0;
              exception.message_.field_2._M_local_buf[0] = '\0';
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
              poVar3 = std::operator<<((ostream *)&ss,"Error: generation of node ");
              poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
              poVar3 = std::operator<<(poVar3," in anyNode (MetainfoSet.cpp file) is not possible");
              poVar3 = std::operator<<(poVar3," because the type ");
              if (*(long **)this_00 == (long *)0x0) {
                puVar4 = &void::typeinfo;
              }
              else {
                puVar4 = (undefined *)(**(code **)(**(long **)this_00 + 0x10))();
              }
              poVar3 = std::operator<<(poVar3,*(char **)(puVar4 + 8) +
                                              (**(char **)(puVar4 + 8) == '*'));
              poVar3 = std::operator<<(poVar3," is not supported\n");
              std::operator<<(poVar3,"This is a bug and should be notified\n");
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_assign((string *)&exception.message_);
              std::__cxx11::string::~string(local_210);
              this_01 = (SerializationException *)__cxa_allocate_exception(0x28);
              SerializationException::SerializationException(this_01,&exception);
              __cxa_throw(this_01,&SerializationException::typeinfo,
                          SerializationException::~SerializationException);
            }
            boost::any_cast<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                       (boost *)this_00,operand);
            ::JSONNode::JSONNode(&local_218,&local_1c8,(json_string *)&ss);
            std::__cxx11::string::~string((string *)&ss);
          }
        }
      }
    }
    std::vector<JSONNode,_std::allocator<JSONNode>_>::emplace_back<JSONNode>
              (__return_storage_ptr__,&local_218);
    ::JSONNode::~JSONNode(&local_218);
    std::__cxx11::string::~string((string *)&local_1c8);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

std::vector< JSONNode> MetainfoSet::GenerateNodes() const
{
    std::vector< JSONNode> res;
    res.reserve(data_.size());
    for (std::map<std::string, boost::any>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        res.push_back(anyNode(iter->first, iter->second));
    }
    return res;
}